

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileReceiveSession.cpp
# Opt level: O0

void __thiscall FileReceiveSession::on_error(FileReceiveSession *this,Poll *p,int e)

{
  bool bVar1;
  path local_40;
  int local_1c;
  Poll *pPStack_18;
  int e_local;
  Poll *p_local;
  FileReceiveSession *this_local;
  
  local_1c = e;
  pPStack_18 = p;
  p_local = (Poll *)this;
  bVar1 = std::function::operator_cast_to_bool((function *)&this->fail);
  if (bVar1) {
    boost::filesystem::path::path(&local_40,&this->file);
    std::function<void_(boost::filesystem::path)>::operator()(&this->fail,&local_40);
    boost::filesystem::path::~path(&local_40);
  }
  Subscriber::on_error(&this->super_Subscriber,pPStack_18,local_1c);
  return;
}

Assistant:

void FileReceiveSession::on_error(Poll &p, int e) {
  if (this->fail)
    this->fail(file);
  Subscriber::on_error(p, e);
}